

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_elements_transaction.cpp
# Opt level: O0

void __thiscall
cfdcapi_elements_transaction_CfdSetReissueTest_Test::TestBody
          (cfdcapi_elements_transaction_CfdSetReissueTest_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  long *expected_predicate_value;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  void **in_stack_00000178;
  AssertionResult gtest_ar_6;
  char *str_buffer;
  void *in_stack_00000198;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  char *asset_string;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_1;
  void *create_handle;
  char *tx_string;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  char *exp_tx;
  char *base_tx;
  char *in_stack_00000450;
  int64_t in_stack_00000458;
  uint32_t in_stack_00000464;
  char *in_stack_00000468;
  void *in_stack_00000470;
  void *in_stack_00000478;
  char *in_stack_00000490;
  char *in_stack_00000498;
  char *in_stack_000004a0;
  char **in_stack_000004a8;
  char *in_stack_fffffffffffffca8;
  char *in_stack_fffffffffffffcb0;
  CfdErrorCode *in_stack_fffffffffffffcb8;
  char **in_stack_fffffffffffffcc0;
  void **in_stack_fffffffffffffcc8;
  void *in_stack_fffffffffffffce8;
  undefined7 in_stack_fffffffffffffd40;
  undefined1 in_stack_fffffffffffffd47;
  char *in_stack_fffffffffffffd48;
  AssertHelper local_238;
  Message local_230;
  undefined4 local_224;
  AssertionResult local_220;
  AssertHelper local_210;
  Message local_208;
  AssertionResult local_200;
  AssertHelper local_1f0;
  Message local_1e8;
  undefined4 local_1dc;
  AssertionResult local_1d8;
  char *local_1c8;
  AssertHelper local_1c0;
  Message local_1b8;
  AssertionResult local_1b0;
  AssertHelper local_1a0;
  Message local_198;
  undefined4 local_18c;
  AssertionResult local_188;
  AssertHelper local_178;
  Message local_170;
  AssertionResult local_168;
  AssertHelper local_158;
  Message local_150;
  undefined4 local_144;
  AssertionResult local_140;
  char *local_130;
  string local_128;
  AssertHelper local_108;
  Message local_100;
  undefined1 local_f1;
  AssertionResult local_f0;
  AssertHelper local_e0;
  Message local_d8;
  undefined4 local_cc;
  AssertionResult local_c8;
  long local_b8;
  char *local_b0;
  string local_a8;
  AssertHelper local_88;
  Message local_80;
  undefined1 local_71;
  AssertionResult local_70;
  AssertHelper local_60;
  Message local_58 [3];
  undefined4 local_3c;
  AssertionResult local_38;
  int local_24;
  long local_20;
  char *local_18;
  char *local_10;
  
  local_10 = 
  "0200000000025e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0000000000ffffffff5e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0200000000ffffffff03017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000029b9270003f4f10478f5fae2c77c44fdb2a304109a9ae8ba7cab1c125deba9e618ca737e851976a91484c2ef274919355bb532a5bbdbfa95490c5d749388ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b97049c03b69e5ef61aef08565404bc3c98d6e4dfd1e02eb94138617d9b3eb12ec790885317a91401e940d9dcd77a5043356941641aa2fd6ec6a68887017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000000002710000000000000"
  ;
  local_18 = 
  "0200000000025e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0000000000ffffffff5e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0200008000ffffffffcf9a1b9aeb2de6a7b7c3177433dced0951fd728dffbe8c935ccb80698f2e08c80683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000029b927000004017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000029b9270003f4f10478f5fae2c77c44fdb2a304109a9ae8ba7cab1c125deba9e618ca737e851976a91484c2ef274919355bb532a5bbdbfa95490c5d749388ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b97049c03b69e5ef61aef08565404bc3c98d6e4dfd1e02eb94138617d9b3eb12ec790885317a91401e940d9dcd77a5043356941641aa2fd6ec6a68887017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000000002710000001cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000029b9270003f234757d0e00e6a7a7a3b4b2b31fb0328d7b9f755cd1093d9f61892fef3116871976a91435ef6d4b59f26089dfe2abca21408e15fee42a3388ac00000000"
  ;
  local_20 = 0;
  local_24 = CfdCreateHandle(in_stack_fffffffffffffcc8);
  local_3c = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffcc8,(char *)in_stack_fffffffffffffcc0,
             in_stack_fffffffffffffcb8,(int *)in_stack_fffffffffffffcb0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_38);
  if (!bVar1) {
    testing::Message::Message(local_58);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x36e768);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x89e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_60,local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    testing::Message::~Message((Message *)0x36e7cb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x36e820);
  local_71 = local_20 != 0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffffcb0,(bool *)in_stack_fffffffffffffca8,
             (type *)0x36e854);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_70);
  if (!bVar1) {
    testing::Message::Message(&local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a8,(internal *)&local_70,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x89f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_88,&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
    testing::Message::~Message((Message *)0x36e950);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x36e9cb);
  local_b0 = (char *)0x0;
  local_b8 = 0;
  expected_predicate_value = &local_b8;
  local_24 = CfdInitializeTransaction
                       (in_stack_00000198,str_buffer._4_4_,(uint32_t)str_buffer,
                        gtest_ar_6.message_.ptr_._4_4_,(char *)gtest_ar_6._0_8_,in_stack_00000178);
  local_cc = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffcc8,(char *)in_stack_fffffffffffffcc0,
             in_stack_fffffffffffffcb8,(int *)in_stack_fffffffffffffcb0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c8);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x36eac0);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x8a5,pcVar2);
    testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    testing::Message::~Message((Message *)0x36eb23);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x36eb78);
  local_f1 = local_b8 != 0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffffcb0,(bool *)in_stack_fffffffffffffca8,
             (type *)0x36ebac);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f0);
  if (!bVar1) {
    testing::Message::Message(&local_100);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_128,(internal *)&local_f0,(AssertionResult *)"(NULL == create_handle)","true",
               "false",(char *)expected_predicate_value);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x8a6,pcVar2);
    testing::internal::AssertHelper::operator=(&local_108,&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    std::__cxx11::string::~string((string *)&local_128);
    testing::Message::~Message((Message *)0x36eca8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x36ed23);
  if (local_24 == 0) {
    local_130 = (char *)0x0;
    in_stack_fffffffffffffcc0 = &local_130;
    in_stack_fffffffffffffcb0 =
         "CTEyBCf1WzQDpbv6sXLTnFaknGK2UJMHqjyGJjQGq9NEytBR2JLHR9cHJSk4MbLVcKQYWsWERUEYN6R3";
    in_stack_fffffffffffffca8 = "6f9ccf5949eba5d6a08bff7a015e825c97824e82d57c8a0c77f9a41908fe8306";
    in_stack_fffffffffffffcb8 = (CfdErrorCode *)0x0;
    local_24 = CfdSetReissueAsset(in_stack_00000478,in_stack_00000470,in_stack_00000468,
                                  in_stack_00000464,in_stack_00000458,in_stack_00000450,
                                  in_stack_00000490,in_stack_00000498,in_stack_000004a0,
                                  in_stack_000004a8);
    local_144 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffcc8,(char *)in_stack_fffffffffffffcc0,
               in_stack_fffffffffffffcb8,(int *)in_stack_fffffffffffffcb0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_140);
    if (!bVar1) {
      testing::Message::Message(&local_150);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x36ee4b);
      testing::internal::AssertHelper::AssertHelper
                (&local_158,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x8b1,pcVar2);
      testing::internal::AssertHelper::operator=(&local_158,&local_150);
      testing::internal::AssertHelper::~AssertHelper(&local_158);
      testing::Message::~Message((Message *)0x36eeae);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x36ef03);
    if (local_24 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_168,
                 "\"accb7354c07974e00b32e4e5eef55078490141675592ac3610e6101831edb0cd\"",
                 "asset_string","accb7354c07974e00b32e4e5eef55078490141675592ac3610e6101831edb0cd",
                 local_130);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_168);
      if (!bVar1) {
        testing::Message::Message(&local_170);
        in_stack_fffffffffffffd48 =
             testing::AssertionResult::failure_message((AssertionResult *)0x36efb2);
        testing::internal::AssertHelper::AssertHelper
                  (&local_178,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x8b3,in_stack_fffffffffffffd48);
        testing::internal::AssertHelper::operator=(&local_178,&local_170);
        testing::internal::AssertHelper::~AssertHelper(&local_178);
        testing::Message::~Message((Message *)0x36f015);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x36f06a);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffffcb8);
    }
  }
  if (local_24 == 0) {
    local_24 = CfdFinalizeTransaction
                         (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,(char **)0x36f0b8);
    local_18c = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffcc8,(char *)in_stack_fffffffffffffcc0,
               in_stack_fffffffffffffcb8,(int *)in_stack_fffffffffffffcb0);
    in_stack_fffffffffffffd47 = testing::AssertionResult::operator_cast_to_bool(&local_188);
    if (!(bool)in_stack_fffffffffffffd47) {
      testing::Message::Message(&local_198);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x36f15a);
      testing::internal::AssertHelper::AssertHelper
                (&local_1a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x8ba,pcVar2);
      testing::internal::AssertHelper::operator=(&local_1a0,&local_198);
      testing::internal::AssertHelper::~AssertHelper(&local_1a0);
      testing::Message::~Message((Message *)0x36f1bd);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x36f212);
    if (local_24 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_1b0,"exp_tx","tx_string",local_18,local_b0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1b0);
      if (!bVar1) {
        testing::Message::Message(&local_1b8);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x36f2bc);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x8bc,pcVar2);
        testing::internal::AssertHelper::operator=(&local_1c0,&local_1b8);
        testing::internal::AssertHelper::~AssertHelper(&local_1c0);
        testing::Message::~Message((Message *)0x36f319);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x36f36e);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffffcb8);
    }
  }
  CfdFreeTransactionHandle(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
  local_24 = CfdGetLastErrorCode(in_stack_fffffffffffffce8);
  if (local_24 != 0) {
    local_1c8 = (char *)0x0;
    local_24 = CfdGetLastErrorMessage
                         (in_stack_fffffffffffffd48,
                          (char **)CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40));
    local_1dc = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffcc8,(char *)in_stack_fffffffffffffcc0,
               in_stack_fffffffffffffcb8,(int *)in_stack_fffffffffffffcb0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1d8);
    if (!bVar1) {
      testing::Message::Message(&local_1e8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x36f47f);
      testing::internal::AssertHelper::AssertHelper
                (&local_1f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x8c7,pcVar2);
      testing::internal::AssertHelper::operator=(&local_1f0,&local_1e8);
      testing::internal::AssertHelper::~AssertHelper(&local_1f0);
      testing::Message::~Message((Message *)0x36f4dc);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x36f531);
    testing::internal::CmpHelperSTREQ((internal *)&local_200,"\"\"","str_buffer","",local_1c8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_200);
    if (!bVar1) {
      testing::Message::Message(&local_208);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x36f5c6);
      testing::internal::AssertHelper::AssertHelper
                (&local_210,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x8c8,pcVar2);
      testing::internal::AssertHelper::operator=(&local_210,&local_208);
      testing::internal::AssertHelper::~AssertHelper(&local_210);
      testing::Message::~Message((Message *)0x36f623);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x36f678);
    CfdFreeStringBuffer((char *)in_stack_fffffffffffffcb8);
    local_1c8 = (char *)0x0;
  }
  local_24 = CfdFreeHandle(in_stack_fffffffffffffcb8);
  local_224 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffcc8,(char *)in_stack_fffffffffffffcc0,
             in_stack_fffffffffffffcb8,(int *)in_stack_fffffffffffffcb0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_220);
  if (!bVar1) {
    testing::Message::Message(&local_230);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x36f748);
    testing::internal::AssertHelper::AssertHelper
              (&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x8ce,pcVar2);
    testing::internal::AssertHelper::operator=(&local_238,&local_230);
    testing::internal::AssertHelper::~AssertHelper(&local_238);
    testing::Message::~Message((Message *)0x36f7a5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x36f7fa);
  return;
}

Assistant:

TEST(cfdcapi_elements_transaction, CfdSetReissueTest) {
  const char* base_tx = "0200000000025e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0000000000ffffffff5e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0200000000ffffffff03017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000029b9270003f4f10478f5fae2c77c44fdb2a304109a9ae8ba7cab1c125deba9e618ca737e851976a91484c2ef274919355bb532a5bbdbfa95490c5d749388ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b97049c03b69e5ef61aef08565404bc3c98d6e4dfd1e02eb94138617d9b3eb12ec790885317a91401e940d9dcd77a5043356941641aa2fd6ec6a68887017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000000002710000000000000";
  const char* exp_tx = "0200000000025e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0000000000ffffffff5e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0200008000ffffffffcf9a1b9aeb2de6a7b7c3177433dced0951fd728dffbe8c935ccb80698f2e08c80683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000029b927000004017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000029b9270003f4f10478f5fae2c77c44fdb2a304109a9ae8ba7cab1c125deba9e618ca737e851976a91484c2ef274919355bb532a5bbdbfa95490c5d749388ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b97049c03b69e5ef61aef08565404bc3c98d6e4dfd1e02eb94138617d9b3eb12ec790885317a91401e940d9dcd77a5043356941641aa2fd6ec6a68887017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000000002710000001cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000029b9270003f234757d0e00e6a7a7a3b4b2b31fb0328d7b9f755cd1093d9f61892fef3116871976a91435ef6d4b59f26089dfe2abca21408e15fee42a3388ac00000000";

  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  char* tx_string = nullptr;

  void* create_handle = nullptr;
  ret = CfdInitializeTransaction(handle, kCfdNetworkLiquidv1, 2, 0, base_tx, &create_handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == create_handle));
  if (ret == kCfdSuccess) {
    char* asset_string = nullptr;
    ret = CfdSetReissueAsset(
      handle, create_handle,
      "8d9123637c61017f29201542f30511bdc53ad32309df2b647128b02d54a3675e", 2,
      700000000,
      "c8082e8f6980cb5c938cbeff8d72fd5109eddc337417c3b7a7e62deb9a1b9acf",
      "6f9ccf5949eba5d6a08bff7a015e825c97824e82d57c8a0c77f9a41908fe8306",
      "CTEyBCf1WzQDpbv6sXLTnFaknGK2UJMHqjyGJjQGq9NEytBR2JLHR9cHJSk4MbLVcKQYWsWERUEYN6R3",
      nullptr, &asset_string);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("accb7354c07974e00b32e4e5eef55078490141675592ac3610e6101831edb0cd", asset_string);
      CfdFreeStringBuffer(asset_string);
    }
  }

  if (ret == kCfdSuccess) {
    ret = CfdFinalizeTransaction(handle, create_handle, &tx_string);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ(exp_tx, tx_string);
      CfdFreeStringBuffer(tx_string);
    }
  }

  CfdFreeTransactionHandle(handle, create_handle);

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}